

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int bounds_check(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint8_t *puVar5;
  char cVar6;
  long lVar7;
  
  if (state->room_index == '\0') {
    uVar2 = (state->saved_mappos).pos16.u;
    puVar5 = &walls[0].maxx;
    cVar6 = -0x18;
    while (((uVar2 < (ushort)((ushort)((wall_t *)(puVar5 + -1))->minx * 8 + 2) ||
            ((ushort)((ushort)*puVar5 * 8 + 4) <= uVar2)) ||
           ((uVar3 = (state->saved_mappos).pos16.v, uVar3 < (ushort)((ushort)puVar5[1] << 3) ||
            ((((ushort)((ushort)puVar5[2] << 3 | 4) <= uVar3 ||
              (uVar3 = (state->saved_mappos).pos16.w, uVar3 < (ushort)((ushort)puVar5[3] << 3))) ||
             ((ushort)((ushort)puVar5[4] << 3 | 2) <= uVar3))))))) {
      puVar5 = puVar5 + 6;
      cVar6 = cVar6 + '\x01';
      if (cVar6 == '\0') {
        return 0;
      }
    }
    vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
    return 1;
  }
  bVar1 = state->roomdef_dimensions_index;
  uVar2 = (state->saved_mappos).pos16.u;
  if (((((ushort)(interior_bounds_check::roomdef_dimensions[bVar1].x0 + 4) < uVar2) &&
       (uVar2 <= interior_bounds_check::roomdef_dimensions[bVar1].x1)) &&
      (uVar3 = (state->saved_mappos).pos16.v,
      interior_bounds_check::roomdef_dimensions[bVar1].y0 < uVar3)) &&
     ((int)(uint)uVar3 <= (int)(interior_bounds_check::roomdef_dimensions[bVar1].y1 - 4))) {
    iVar4 = 0;
    for (lVar7 = 0; state->roomdef_object_bounds_count != (uint8_t)lVar7; lVar7 = lVar7 + 1) {
      if (((state->roomdef_object_bounds[lVar7].x0 <= uVar2) &&
          (uVar2 < state->roomdef_object_bounds[lVar7].x1)) &&
         (((ushort)state->roomdef_object_bounds[lVar7].y0 <= (uVar3 & 0xff) &&
          ((byte)uVar3 < state->roomdef_object_bounds[lVar7].y1)))) goto LAB_001087e9;
    }
  }
  else {
LAB_001087e9:
    vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int bounds_check(tgestate_t *state, vischar_t *vischar)
{
  uint8_t       iters; /* was B */
  const wall_t *wall;  /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (state->room_index > room_0_OUTDOORS)
    return interior_bounds_check(state, vischar);

  iters = NELEMS(walls); /* All walls and fences. */
  wall  = &walls[0];
  do
  {
    uint16_t minx, maxx, miny, maxy, minheight, maxheight;

    minx      = wall->minx      * 8;
    maxx      = wall->maxx      * 8;
    miny      = wall->miny      * 8;
    maxy      = wall->maxy      * 8;
    minheight = wall->minheight * 8;
    maxheight = wall->maxheight * 8;

    if (state->saved_mappos.pos16.u >= minx + 2   &&
        state->saved_mappos.pos16.u <  maxx + 4   &&
        state->saved_mappos.pos16.v >= miny       &&
        state->saved_mappos.pos16.v <  maxy + 4   &&
        state->saved_mappos.pos16.w >= minheight  &&
        state->saved_mappos.pos16.w <  maxheight + 2)
    {
      vischar->counter_and_flags ^= vischar_BYTE7_V_DOMINANT;
      return 1; // NZ => outwith wall bounds
    }

    wall++;
  }
  while (--iters);

  return 0; // Z => within wall bounds
}